

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_transaction.cpp
# Opt level: O2

TransactionController * __thiscall
cfd::api::TransactionApi::AddSign
          (TransactionController *__return_storage_ptr__,TransactionApi *this,string *hex,Txid *txid
          ,uint32_t vout,
          vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *sign_params,
          bool is_witness,bool clear_stack)

{
  code *local_28 [2];
  code *local_18;
  code *local_10;
  
  local_28[1] = (code *)0x0;
  local_28[0] = CreateController;
  local_10 = std::
             _Function_handler<cfd::TransactionController_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_cfd::TransactionController_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<cfd::TransactionController_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_cfd::TransactionController_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
             ::_M_manager;
  TransactionApiBase::AddSign<cfd::TransactionController>
            (__return_storage_ptr__,
             (function<cfd::TransactionController_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)local_28,hex,txid,vout,sign_params,is_witness,clear_stack);
  std::_Function_base::~_Function_base((_Function_base *)local_28);
  return __return_storage_ptr__;
}

Assistant:

TransactionController TransactionApi::AddSign(
    const std::string& hex, const Txid& txid, const uint32_t vout,
    const std::vector<SignParameter>& sign_params, bool is_witness,
    bool clear_stack) const {
  return TransactionApiBase::AddSign<TransactionController>(
      cfd::api::CreateController, hex, txid, vout, sign_params, is_witness,
      clear_stack);
}